

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

bool __thiscall protozero::pbf_reader::next(pbf_reader *this)

{
  pbf_wire_type pVar1;
  invalid_tag_exception *this_00;
  unknown_pbf_wire_type_exception *this_01;
  uint value;
  pbf_reader *this_local;
  
  if (this->m_data == this->m_end) {
    this_local._7_1_ = false;
  }
  else {
    pVar1 = get_varint<unsigned_int>(this);
    this->m_tag = pVar1 >> 3;
    if ((this->m_tag == 0) || ((18999 < this->m_tag && (this->m_tag < 20000)))) {
      this_00 = (invalid_tag_exception *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      invalid_tag_exception::invalid_tag_exception(this_00);
      __cxa_throw(this_00,&invalid_tag_exception::typeinfo,
                  invalid_tag_exception::~invalid_tag_exception);
    }
    this->m_wire_type = pVar1 & 7;
    if ((length_delimited < this->m_wire_type) && (this->m_wire_type != fixed32)) {
      this_01 = (unknown_pbf_wire_type_exception *)__cxa_allocate_exception(8);
      memset(this_01,0,8);
      unknown_pbf_wire_type_exception::unknown_pbf_wire_type_exception(this_01);
      __cxa_throw(this_01,&unknown_pbf_wire_type_exception::typeinfo,
                  unknown_pbf_wire_type_exception::~unknown_pbf_wire_type_exception);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool next() {
        if (m_data == m_end) {
            return false;
        }

        const auto value = get_varint<uint32_t>();
        m_tag = static_cast<pbf_tag_type>(value >> 3U);

        // tags 0 and 19000 to 19999 are not allowed as per
        // https://developers.google.com/protocol-buffers/docs/proto#assigning-tags
        if (m_tag == 0 || (m_tag >= 19000 && m_tag <= 19999)) {
            throw invalid_tag_exception{};
        }

        m_wire_type = pbf_wire_type(value & 0x07U);
        switch (m_wire_type) {
            case pbf_wire_type::varint:
            case pbf_wire_type::fixed64:
            case pbf_wire_type::length_delimited:
            case pbf_wire_type::fixed32:
                break;
            default:
                throw unknown_pbf_wire_type_exception{};
        }

        return true;
    }